

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O1

CURLcode cw_out_flush_chain(cw_out_ctx *ctx,Curl_easy *data,cw_out_buf **pcwbuf,_Bool flush_all)

{
  dynbuf *s;
  cw_out_type otype;
  cw_out_buf *pcVar1;
  cw_out_buf *pcVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  cw_out_buf *pcwbuf_00;
  size_t sVar5;
  char *pcVar6;
  char *buf;
  size_t consumed;
  size_t *in_stack_ffffffffffffffb8;
  size_t local_38;
  
  pcVar1 = *pcwbuf;
  CVar4 = CURLE_OK;
  if ((pcVar1 != (cw_out_buf *)0x0) && (CVar3 = CURLE_OK, (ctx->field_0x28 & 1) == 0)) {
    do {
      CVar4 = CVar3;
      pcVar2 = pcVar1;
      if (pcVar1->next == (cw_out_buf *)0x0) {
        s = &pcVar1->b;
        sVar5 = Curl_dyn_len(s);
        if (sVar5 != 0) {
          otype = pcVar1->type;
          pcVar6 = Curl_dyn_ptr(s);
          buf = (char *)Curl_dyn_len(s);
          CVar4 = cw_out_ptr_flush(ctx,data,otype,SUB81(pcVar6,0),buf,(size_t)&local_38,
                                   in_stack_ffffffffffffffb8);
          if (CVar4 != CURLE_OK) goto LAB_00122aff;
          if (local_38 != 0) {
            sVar5 = Curl_dyn_len(s);
            if (local_38 == sVar5) {
              Curl_dyn_free(s);
            }
            else {
              sVar5 = Curl_dyn_len(s);
              CVar4 = Curl_dyn_tail(s,sVar5 - local_38);
              if (CVar4 != CURLE_OK) goto LAB_00122aff;
            }
          }
        }
        CVar4 = CURLE_OK;
LAB_00122aff:
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        sVar5 = Curl_dyn_len(s);
        if (sVar5 != 0) {
          return CURLE_OK;
        }
        Curl_dyn_free(s);
        (*Curl_cfree)(pcVar1);
        *pcwbuf = (cw_out_buf *)0x0;
        return CURLE_OK;
      }
      do {
        pcwbuf_00 = pcVar2;
        pcVar2 = pcwbuf_00->next;
      } while (pcwbuf_00->next->next != (cw_out_buf *)0x0);
      CVar3 = cw_out_flush_chain(ctx,data,&pcwbuf_00->next,flush_all);
      if (CVar3 == CURLE_OK) {
        flush_all = pcwbuf_00->next == (cw_out_buf *)0x0;
        if (!flush_all) {
          CVar4 = CURLE_OK;
        }
      }
      else {
        flush_all = false;
        CVar4 = CVar3;
      }
      CVar3 = CVar4;
    } while (flush_all != false);
  }
  return CVar4;
}

Assistant:

static CURLcode cw_out_flush_chain(struct cw_out_ctx *ctx,
                                   struct Curl_easy *data,
                                   struct cw_out_buf **pcwbuf,
                                   bool flush_all)
{
  struct cw_out_buf *cwbuf = *pcwbuf;
  CURLcode result;

  if(!cwbuf)
    return CURLE_OK;
  if(ctx->paused)
    return CURLE_OK;

  /* write the end of the chain until it blocks or gets empty */
  while(cwbuf->next) {
    struct cw_out_buf **plast = &cwbuf->next;
    while((*plast)->next)
      plast = &(*plast)->next;
    result = cw_out_flush_chain(ctx, data, plast, flush_all);
    if(result)
      return result;
    if(*plast) {
      /* could not write last, paused again? */
      DEBUGASSERT(ctx->paused);
      return CURLE_OK;
    }
  }

  result = cw_out_buf_flush(ctx, data, cwbuf, flush_all);
  if(result)
    return result;
  if(!Curl_dyn_len(&cwbuf->b)) {
    cw_out_buf_free(cwbuf);
    *pcwbuf = NULL;
  }
  return CURLE_OK;
}